

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O1

void run_1D_fdtd(fdtd1D *fdtd,float_type end_time,_Bool verbose)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uintmax_t uVar4;
  float_type *pfVar5;
  float_type *pfVar6;
  float_type *pfVar7;
  border_position1D i;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  float_type fVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double divide;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  time_measure tstart_chunk;
  time_measure tend_chunk;
  double local_80;
  timespec local_68;
  double local_50;
  long local_48;
  timespec local_40;
  
  auVar16._0_8_ = (end_time - fdtd->time) / fdtd->dt;
  auVar16._8_8_ = 0;
  auVar16 = vroundsd_avx(auVar16,auVar16,10);
  dVar14 = auVar16._0_8_;
  if (10.0 <= dVar14) {
    auVar22 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    do {
      auVar23._0_8_ = dVar14 / auVar22._0_8_;
      auVar23._8_8_ = auVar16._8_8_;
      auVar23 = vroundsd_avx(auVar23,auVar23,10);
      dVar15 = auVar23._0_8_;
      auVar22 = ZEXT864((ulong)(auVar22._0_8_ + 1.0));
    } while (dVar14 / dVar15 < 10.0);
  }
  else {
    dVar15 = 1.0;
  }
  clock_gettime(4,&local_68);
  if (fdtd->time < end_time) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar15;
    local_48 = vcvttsd2usi_avx512f(auVar17);
    local_80 = 100.0 / (dVar14 / dVar15);
    lVar1 = local_48 + -1;
    lVar9 = 0;
    local_50 = local_80;
    do {
      uVar4 = fdtd->sizeX;
      if (uVar4 != 1) {
        dVar14 = fdtd->dt;
        dVar15 = fdtd->dx;
        pfVar5 = fdtd->ez;
        pfVar6 = fdtd->hy;
        pfVar7 = fdtd->permeability_inv;
        lVar10 = 0;
        do {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = pfVar7[lVar10];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pfVar6[lVar10];
          auVar18._8_8_ = 0;
          auVar18._0_8_ = (dVar14 / dVar15) * (pfVar5[lVar10 + 1] - pfVar5[lVar10]);
          auVar16 = vfmadd213sd_fma(auVar20,auVar18,auVar2);
          pfVar6[lVar10] = auVar16._0_8_;
          lVar10 = lVar10 + 1;
        } while (uVar4 - 1 != lVar10);
      }
      if (fdtd->num_Msources != 0) {
        lVar10 = 0;
        uVar11 = 0;
        do {
          if (*(int *)((long)&fdtd->Msources->type + lVar10) == 0) {
            fVar13 = gaussian_pulse_val(fdtd->time,
                                        (fdtd_source *)((long)&fdtd->Msources->type + lVar10));
            fdtd->hy[fdtd->MsourceLocations[uVar11]] =
                 fVar13 + fdtd->hy[fdtd->MsourceLocations[uVar11]];
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar11 < fdtd->num_Msources);
      }
      lVar10 = 0;
      do {
        if (fdtd->border_condition[lVar10] == border_perfect_magnetic_conductor) {
          fdtd->hy[(fdtd->sizeX - 1) * lVar10] = 0.0;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 == 1);
      uVar11 = fdtd->sizeX;
      if (1 < uVar11) {
        dVar14 = fdtd->dt;
        dVar15 = fdtd->dx;
        pfVar5 = fdtd->ez;
        pfVar6 = fdtd->hy;
        pfVar7 = fdtd->permittivity_inv;
        uVar8 = 1;
        do {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = pfVar7[uVar8];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pfVar5[uVar8];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = (dVar14 / dVar15) * (pfVar6[uVar8] - pfVar6[uVar8 - 1]);
          auVar16 = vfmadd213sd_fma(auVar21,auVar19,auVar3);
          pfVar5[uVar8] = auVar16._0_8_;
          uVar8 = uVar8 + 1;
        } while (uVar11 != uVar8);
      }
      if (fdtd->num_Jsources != 0) {
        lVar10 = 0;
        uVar11 = 0;
        do {
          if (*(int *)((long)&fdtd->Jsources->type + lVar10) == 0) {
            fVar13 = gaussian_pulse_val(fdtd->time,
                                        (fdtd_source *)((long)&fdtd->Jsources->type + lVar10));
            fdtd->ez[fdtd->JsourceLocations[uVar11]] =
                 fVar13 + fdtd->ez[fdtd->JsourceLocations[uVar11]];
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar11 < fdtd->num_Jsources);
      }
      lVar10 = 0;
      do {
        if (fdtd->border_condition[lVar10] == border_perfect_electric_conductor) {
          fdtd->ez[(fdtd->sizeX - 1) * lVar10] = 0.0;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 == 1);
      lVar10 = lVar9 + 1;
      bVar12 = lVar9 != lVar1;
      lVar9 = 0;
      if (bVar12) {
        lVar9 = lVar10;
      }
      if ((verbose) && (lVar9 == 0)) {
        clock_gettime(4,&local_40);
        if (local_40.tv_nsec < local_68.tv_nsec) {
          dVar14 = (double)((local_40.tv_nsec - local_68.tv_nsec) + 1000000000) / 1000000000.0 +
                   -1.0;
        }
        else {
          dVar14 = (double)(local_40.tv_nsec - local_68.tv_nsec) / 1000000000.0;
        }
        dVar15 = difftime(local_40.tv_sec,local_68.tv_sec);
        printf("%.0f%% -- t=%e dt=%e tend=%e (%zu iter in %.3fs)\n",local_80,fdtd->time,fdtd->dt,
               end_time,dVar15 + dVar14,local_48);
        local_80 = local_80 + local_50;
        local_68.tv_sec = local_40.tv_sec;
        local_68.tv_nsec = local_40.tv_nsec;
      }
      dVar14 = fdtd->dt + fdtd->time;
      fdtd->time = dVar14;
    } while (dVar14 < end_time);
  }
  return;
}

Assistant:

void run_1D_fdtd(struct fdtd1D *fdtd, float_type end_time, bool verbose) {
  const double num_iter_d = ceil((end_time - fdtd->time) / fdtd->dt);
  double print_interval_d;
  if (num_iter_d >= 10.) {
    double divide = 1.;
    do {
      print_interval_d = ceil(num_iter_d / divide);
      divide = divide + 1.;
    } while (num_iter_d / print_interval_d < 10.);
  } else {
    print_interval_d = 1.;
  }
  const size_t print_interval = (size_t)print_interval_d;
  const double percent_increment = 100. / (num_iter_d / print_interval_d);
  const size_t inter_print = print_interval - 1;
  size_t iter_count = 0;
  double percentage = percent_increment;
  time_measure tstart_chunk, tend_chunk;
  get_current_time(&tstart_chunk);
  for (; fdtd->time < end_time; fdtd->time += fdtd->dt) {
    update_magnetic_field(fdtd);
    apply_M_sources(fdtd);
    border_condition_magnetic(fdtd);

    update_electric_field(fdtd);
    apply_J_sources(fdtd);
    border_condition_electric(fdtd);

    iter_count = iter_count == inter_print ? 0 : iter_count + 1;
    if (verbose && iter_count == 0) {
      get_current_time(&tend_chunk);
      double difference = measuring_difftime(tstart_chunk, tend_chunk);
      printf("%.0f%% -- t=%e dt=%e tend=%e (%zu iter in %.3fs)\n", percentage,
             fdtd->time, fdtd->dt, end_time, print_interval, difference);
      percentage += percent_increment;
      tstart_chunk = tend_chunk;
    }
  }
}